

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O3

bool __thiscall NameServer::assignFetchWork(NameServer *this)

{
  int iVar1;
  char *__nptr;
  ostream *poVar2;
  iterator iVar3;
  int *piVar4;
  long lVar5;
  iterator iVar6;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  char *local_78;
  key_type local_70;
  char *local_50 [2];
  char local_40 [16];
  
  if (type == fetch) {
    if (fileid_path_lenMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      p_Var9 = &fileid_path_lenMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var8 = fileid_path_lenMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (fetch_id <= (int)p_Var8[1]._M_color) {
          p_Var9 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < fetch_id];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 !=
           &fileid_path_lenMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
         ((int)p_Var9[1]._M_color <= fetch_id)) {
        std::__cxx11::string::_M_assign((string *)&fetch_filepath_abi_cxx11_);
        goto LAB_00117eef;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No such file with id = ",0x17);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,fetch_id);
  }
  else {
LAB_00117eef:
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&logicFile_BlockFileMap_abi_cxx11_._M_t,&fetch_filepath_abi_cxx11_);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &logicFile_BlockFileMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      p_Var8 = *(_Base_ptr *)(iVar3._M_node + 2);
      p_Var9 = iVar3._M_node[2]._M_parent;
      fetch_blocks = (int)((ulong)((long)p_Var9 - (long)p_Var8) >> 5);
      if (p_Var9 == p_Var8) {
        return true;
      }
      while( true ) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,*(long *)p_Var8,
                   (long)&p_Var8->_M_parent->_M_color + *(long *)p_Var8);
        std::__cxx11::string::find_last_of((char *)&local_70,0x13339e,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
        __nptr = local_50[0];
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtol(__nptr,&local_78,10);
        if (local_78 == __nptr) break;
        if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_001180bc;
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find(&block_serversMap_abi_cxx11_._M_t,&local_70);
        fetch_servers[lVar5] = **(int **)(iVar6._M_node + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        p_Var8 = p_Var8 + 1;
        if (p_Var8 == p_Var9) {
          return true;
        }
      }
      std::__throw_invalid_argument("stoi");
LAB_001180bc:
      uVar7 = std::__throw_out_of_range("stoi");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      _Unwind_Resume(uVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No such file with path = ",0x19);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,fetch_filepath_abi_cxx11_._M_dataplus._M_p,
                        fetch_filepath_abi_cxx11_._M_string_length);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool assignFetchWork() const
    {

        if (type == MsgType::fetch)
        {
            auto fileInfo = fileid_path_lenMap.find(fetch_id);
            if (fileInfo == fileid_path_lenMap.end())
            {
                cerr << "No such file with id = " << fetch_id << endl;
                return false;
            }
            fetch_filepath = fileInfo->second.first;
        }

        auto all_blocks = logicFile_BlockFileMap.find(fetch_filepath);

        if (all_blocks == logicFile_BlockFileMap.end())
        {
            cerr << "No such file with path = " << fetch_filepath << endl;
            return false;
        }

        fetch_blocks = all_blocks->second.size();

                // block_serversMap
        for (auto b : all_blocks->second)
        {
            auto part_pos = b.find_last_of("part");
            int blockID = stoi(b.substr(part_pos + 1));
            auto servers = block_serversMap.find(b);
            fetch_servers[blockID] = servers->second[0];

        }

        return true;
    }